

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O1

int bgzf_index_dump(BGZF *fp,char *bname,char *suffix)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  FILE *__s;
  ulong uVar4;
  bgzidx_t *pbVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint64_t x;
  ulong local_40;
  size_t local_38;
  
  iVar1 = bgzf_flush(fp);
  iVar6 = -1;
  if (iVar1 == 0) {
    if (fp->idx == (bgzidx_t *)0x0) {
      __assert_fail("fp->idx",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/bgzf.c"
                    ,0x3cc,"int bgzf_index_dump(BGZF *, const char *, const char *)");
    }
    if (suffix == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar2 = strlen(bname);
      sVar3 = strlen(suffix);
      local_38 = sVar2;
      __dest = (char *)malloc((long)((int)sVar3 + (int)sVar2 + 1));
      if (__dest == (char *)0x0) {
        return -1;
      }
      local_38 = (size_t)(int)local_38;
      memcpy(__dest,bname,local_38);
      memcpy(__dest + local_38,suffix,(long)((sVar3 << 0x20) + 0x100000000) >> 0x20);
    }
    if (__dest != (char *)0x0) {
      bname = __dest;
    }
    __s = fopen(bname,"wb");
    if (__dest != (char *)0x0) {
      free(__dest);
    }
    if (__s != (FILE *)0x0) {
      if ((fp->field_0x2 & 0xc) == 0) {
        local_40 = (long)fp->idx->noffs - 1;
        lVar7 = 1;
        fwrite(&local_40,1,8,__s);
        pbVar5 = fp->idx;
        if (1 < pbVar5->noffs) {
          lVar8 = 0x10;
          do {
            fwrite((void *)((long)&pbVar5->offs->caddr + lVar8),1,8,__s);
            fwrite((void *)((long)&fp->idx->offs->uaddr + lVar8),1,8,__s);
            lVar7 = lVar7 + 1;
            pbVar5 = fp->idx;
            lVar8 = lVar8 + 0x10;
          } while (lVar7 < pbVar5->noffs);
        }
      }
      else {
        uVar4 = (long)fp->idx->noffs - 1;
        local_40 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                   (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                   (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                   | uVar4 << 0x38;
        lVar7 = 1;
        fwrite(&local_40,1,8,__s);
        pbVar5 = fp->idx;
        if (1 < pbVar5->noffs) {
          lVar8 = 0;
          do {
            uVar4 = *(ulong *)((long)&pbVar5->offs[1].caddr + lVar8);
            local_40 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                       (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                       (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
            fwrite(&local_40,1,8,__s);
            uVar4 = *(ulong *)((long)&fp->idx->offs[1].uaddr + lVar8);
            local_40 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                       (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                       (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                       (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
            fwrite(&local_40,1,8,__s);
            lVar7 = lVar7 + 1;
            pbVar5 = fp->idx;
            lVar8 = lVar8 + 0x10;
          } while (lVar7 < pbVar5->noffs);
        }
      }
      fclose(__s);
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int bgzf_index_dump(BGZF *fp, const char *bname, const char *suffix)
{
    if (bgzf_flush(fp) != 0) return -1;

    assert(fp->idx);
    char *tmp = NULL;
    if ( suffix )
    {
        int blen = strlen(bname);
        int slen = strlen(suffix);
        tmp = (char*) malloc(blen + slen + 1);
        if ( !tmp ) return -1;
        memcpy(tmp,bname,blen);
        memcpy(tmp+blen,suffix,slen+1);
    }

    FILE *idx = fopen(tmp?tmp:bname,"wb");
    if ( tmp ) free(tmp);
    if ( !idx ) return -1;

    // Note that the index contains one extra record when indexing files opened
    // for reading. The terminating record is not present when opened for writing.
    // This is not a bug.

    int i;
    if ( fp->is_be )
    {
        uint64_t x = fp->idx->noffs - 1;
        fwrite(ed_swap_8p(&x), 1, sizeof(x), idx);
        for (i=1; i<fp->idx->noffs; i++)
        {
            x = fp->idx->offs[i].caddr; fwrite(ed_swap_8p(&x), 1, sizeof(x), idx);
            x = fp->idx->offs[i].uaddr; fwrite(ed_swap_8p(&x), 1, sizeof(x), idx);
        }
    }
    else
    {
        uint64_t x = fp->idx->noffs - 1;
        fwrite(&x, 1, sizeof(x), idx);
        for (i=1; i<fp->idx->noffs; i++)
        {
            fwrite(&fp->idx->offs[i].caddr, 1, sizeof(fp->idx->offs[i].caddr), idx);
            fwrite(&fp->idx->offs[i].uaddr, 1, sizeof(fp->idx->offs[i].uaddr), idx);
        }
    }
    fclose(idx);
    return 0;
}